

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLCommon.cpp
# Opt level: O0

void __thiscall ODDLParser::Property::~Property(Property *this)

{
  Text *this_00;
  Value *this_01;
  Reference *this_02;
  Property *this_03;
  Property *this_local;
  
  this_00 = this->m_key;
  if (this_00 != (Text *)0x0) {
    Text::~Text(this_00);
    operator_delete(this_00);
  }
  if ((this->m_value != (Value *)0x0) && (this_01 = this->m_value, this_01 != (Value *)0x0)) {
    Value::~Value(this_01);
    operator_delete(this_01);
  }
  if ((this->m_ref != (Reference *)0x0) && (this_02 = this->m_ref, this_02 != (Reference *)0x0)) {
    Reference::~Reference(this_02);
    operator_delete(this_02);
  }
  if ((this->m_next != (Property *)0x0) && (this_03 = this->m_next, this_03 != (Property *)0x0)) {
    ~Property(this_03);
    operator_delete(this_03);
  }
  return;
}

Assistant:

Property::~Property() {
    delete m_key;
    if(m_value!=ddl_nullptr)
        delete m_value;
    if(m_ref!=ddl_nullptr)
        delete(m_ref);
    if(m_next!=ddl_nullptr)
        delete m_next;
}